

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall HttpResponse::parseHttpHeaders(HttpResponse *this)

{
  StringBufferHelper *pSVar1;
  bool bVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  allocator local_e9;
  string local_e8 [32];
  StringBufferHelper local_c8;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [40];
  string value;
  string local_30 [8];
  string key;
  HttpResponse *this_local;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string((string *)(local_70 + 0x20));
  while( true ) {
    pSVar1 = this->_pRawBuffer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,": ",&local_91);
    StringBufferHelper::GetNextSegmentBySeparator((StringBufferHelper *)local_70,&pSVar1->_buffer);
    std::__cxx11::string::operator=(local_30,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"NA");
    if (bVar2) break;
    pSVar1 = this->_pRawBuffer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"\n",&local_e9);
    StringBufferHelper::GetNextSegmentBySeparator(&local_c8,&pSVar1->_buffer);
    std::__cxx11::string::operator=((string *)(local_70 + 0x20),(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_70 + 0x20));
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->_headerMap,&local_130);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_130);
  }
  std::__cxx11::string::~string((string *)(local_70 + 0x20));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void HttpResponse::parseHttpHeaders() {
  string key, value;

  while (true) {
    key = _pRawBuffer->GetNextSegmentBySeparator(": ");
    if (key == "NA")
      break;
    value = _pRawBuffer->GetNextSegmentBySeparator("\n");
    _headerMap.insert(std::pair<string, string>(key, value));
  }
}